

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5ExprAddChildren(Fts5ExprNode *p,Fts5ExprNode *pSub)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = p->nChild;
  lVar4 = (long)iVar1;
  if ((p->eType == 3) || (pSub->eType != p->eType)) {
    iVar2 = iVar1 + 1;
    p->nChild = iVar2;
    p->apChild[lVar4] = pSub;
  }
  else {
    memcpy(p->apChild + lVar4,pSub->apChild,(long)(pSub->nChild << 3));
    p->nChild = p->nChild + pSub->nChild;
    sqlite3_free(pSub);
    iVar2 = p->nChild;
    if (iVar2 <= iVar1) {
      return;
    }
  }
  iVar1 = p->iHeight;
  do {
    iVar3 = p->apChild[lVar4]->iHeight + 1;
    if (iVar1 <= iVar3) {
      iVar1 = iVar3;
    }
    p->iHeight = iVar1;
    lVar4 = lVar4 + 1;
  } while (iVar2 != lVar4);
  return;
}

Assistant:

static void fts5ExprAddChildren(Fts5ExprNode *p, Fts5ExprNode *pSub){
  int ii = p->nChild;
  if( p->eType!=FTS5_NOT && pSub->eType==p->eType ){
    int nByte = sizeof(Fts5ExprNode*) * pSub->nChild;
    memcpy(&p->apChild[p->nChild], pSub->apChild, nByte);
    p->nChild += pSub->nChild;
    sqlite3_free(pSub);
  }else{
    p->apChild[p->nChild++] = pSub;
  }
  for( ; ii<p->nChild; ii++){
    p->iHeight = MAX(p->iHeight, p->apChild[ii]->iHeight + 1);
  }
}